

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  LogMessageFatal aLStack_38 [16];
  
  pcVar2 = this->buffer_end_;
  if ((long)size <= (long)(pcVar2 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar2 = this->buffer_end_;
  }
  iVar1 = ((int)pcVar2 - (int)ptr) + 0x10;
  while( true ) {
    iVar3 = size - iVar1;
    if (iVar3 == 0 || size < iVar1) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,0x183,0x11,"size > chunk_size");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar2 = Next(this);
    if (pcVar2 == (char *)0x0) break;
    ptr = pcVar2 + 0x10;
    iVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    size = iVar3;
    if (iVar3 <= iVar1) {
      std::__cxx11::string::append((char *)str,(ulong)ptr);
      return ptr + iVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}